

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  bool bVar1;
  undefined1 local_48 [8];
  ImDrawCmd draw_cmd;
  ImDrawList *this_local;
  
  draw_cmd.UserCallbackData = this;
  ImDrawCmd::ImDrawCmd((ImDrawCmd *)local_48);
  local_48._0_4_ = (this->_CmdHeader).ClipRect.x;
  local_48._4_4_ = (this->_CmdHeader).ClipRect.y;
  draw_cmd.ClipRect.x = (this->_CmdHeader).ClipRect.z;
  draw_cmd.ClipRect.y = (this->_CmdHeader).ClipRect.w;
  draw_cmd.ClipRect._8_8_ = (this->_CmdHeader).TextureId;
  draw_cmd.TextureId._0_4_ = (this->_CmdHeader).VtxOffset;
  draw_cmd.TextureId._4_4_ = (this->IdxBuffer).Size;
  bVar1 = false;
  if (local_48._0_4_ <= draw_cmd.ClipRect.x) {
    bVar1 = local_48._4_4_ <= draw_cmd.ClipRect.y;
  }
  if (!bVar1) {
    __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_draw.cpp"
                  ,0x1bc,"void ImDrawList::AddDrawCmd()");
  }
  ImVector<ImDrawCmd>::push_back(&this->CmdBuffer,(ImDrawCmd *)local_48);
  return;
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = _CmdHeader.ClipRect;    // Same as calling ImDrawCmd_HeaderCopy()
    draw_cmd.TextureId = _CmdHeader.TextureId;
    draw_cmd.VtxOffset = _CmdHeader.VtxOffset;
    draw_cmd.IdxOffset = IdxBuffer.Size;

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}